

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

void introsort_loop(int *a,int n,int lim)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int tmp_1;
  uint uVar12;
  bool bVar13;
  
  if (0x10 < n) {
    do {
      bVar13 = lim == 0;
      lim = lim + -1;
      if (bVar13) {
        uVar12 = 1;
        do {
          uVar12 = uVar12 + 1;
          uVar6 = uVar12;
          do {
            uVar7 = (int)uVar6 / 2;
            iVar1 = a[(long)(int)uVar6 + -1];
            if (iVar1 <= a[(long)(int)uVar7 + -1]) break;
            a[(long)(int)uVar6 + -1] = a[(long)(int)uVar7 + -1];
            a[(long)(int)uVar7 + -1] = iVar1;
            bVar13 = 3 < (int)uVar6;
            uVar6 = uVar7;
          } while (bVar13);
        } while (uVar12 != n);
        uVar8 = (ulong)(uint)n;
        do {
          iVar1 = *a;
          *a = a[uVar8 - 1];
          a[uVar8 - 1] = iVar1;
          if (uVar8 != 2) {
            uVar12 = 2;
            uVar6 = 1;
            do {
              if (((long)(uVar8 - 1) <= (long)(int)uVar12) ||
                 (uVar7 = uVar12 | 1, a[(long)(int)(uVar12 | 1) + -1] <= a[(long)(int)uVar12 + -1]))
              {
                uVar7 = uVar12;
              }
              iVar1 = a[(long)(int)uVar6 + -1];
              if (a[(long)(int)uVar7 + -1] <= iVar1) break;
              a[(long)(int)uVar6 + -1] = a[(long)(int)uVar7 + -1];
              a[(long)(int)uVar7 + -1] = iVar1;
              uVar12 = uVar7 * 2;
              uVar6 = uVar7;
            } while ((long)(int)uVar12 < (long)uVar8);
          }
          bVar13 = (long)uVar8 < 3;
          uVar8 = uVar8 - 1;
          if (bVar13) {
            return;
          }
        } while( true );
      }
      iVar1 = *a;
      iVar2 = a[(uint)n >> 1];
      iVar3 = a[(ulong)(uint)n - 1];
      if (iVar2 < iVar1) {
        iVar5 = iVar1;
        if ((iVar3 < iVar1) && (iVar5 = iVar3, iVar3 < iVar2)) {
          iVar5 = iVar2;
        }
      }
      else {
        iVar5 = iVar2;
        if ((iVar3 < iVar2) && (iVar5 = iVar3, iVar3 < iVar1)) {
          iVar5 = iVar1;
        }
      }
      lVar11 = 0;
      uVar8 = (ulong)(uint)n;
      while( true ) {
        uVar12 = (int)lVar11 - 1;
        lVar9 = (lVar11 << 0x20) + -0x100000000;
        lVar11 = (long)(int)lVar11;
        do {
          lVar10 = lVar11;
          lVar9 = lVar9 + 0x100000000;
          iVar1 = a[lVar10];
          lVar11 = lVar10 + 1;
          uVar12 = uVar12 + 1;
        } while (iVar1 <= iVar5);
        uVar8 = (ulong)(int)uVar8;
        do {
          lVar4 = uVar8 - 1;
          uVar8 = uVar8 - 1;
        } while (iVar5 <= a[lVar4]);
        if ((long)uVar8 <= lVar10) break;
        a[lVar10] = a[lVar4];
        a[uVar8] = iVar1;
      }
      introsort_loop((int *)((lVar9 >> 0x1e) + (long)a),n - uVar12,lim);
      n = uVar12;
    } while (0x10 < lVar10);
  }
  return;
}

Assistant:

static void
introsort_loop(int *a, int n, int lim)
{
    int p;
    while (n > 16) {
        if (lim == 0) {
            heap_sort(a, n);
            return;
        }
        --lim;
        p = partition(a, n, median(a[0], a[n/2], a[n-1]));
        introsort_loop(a + p, n - p, lim);
        n = p;
    }
}